

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void ts_parser__advance(TSParser *self,StackVersion version,_Bool allow_node_reuse)

{
  TSLanguage *pTVar1;
  Stack *self_00;
  Lexer *pLVar2;
  _Bool _Var3;
  TSSymbol TVar4;
  TSStateId TVar5;
  uint32_t uVar6;
  Subtree last_external_token_00;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  Length LVar10;
  MutableSubtree local_98;
  MutableSubtree mutable_lookahead;
  StackVersion reduction_version;
  byte bStack_84;
  _Bool is_fragile;
  TSStateId next_state;
  TSParseAction action;
  uint32_t i;
  StackVersion last_reduction_version;
  undefined1 local_60 [8];
  TableEntry table_entry;
  Subtree lookahead;
  _Bool did_reuse;
  Subtree last_external_token;
  uint32_t local_28;
  TSStateId local_18;
  byte local_15;
  uint32_t position;
  TSStateId state;
  _Bool allow_node_reuse_local;
  StackVersion version_local;
  TSParser *self_local;
  
  local_15 = allow_node_reuse;
  position = version;
  _state = self;
  local_18 = ts_stack_state(self->stack,version);
  LVar10 = ts_stack_position(_state->stack,position);
  last_external_token = LVar10._0_8_;
  local_28 = LVar10.bytes;
  last_external_token_00 = ts_stack_last_external_token(_state->stack,position);
  memset(&table_entry.action_count,0,8);
  memset(local_60,0,0x10);
  if ((local_15 & 1) != 0) {
    table_entry._8_8_ =
         ts_parser__reuse_node
                   (_state,position,&local_18,local_28,last_external_token_00,(TableEntry *)local_60
                   );
  }
  bVar9 = table_entry._8_8_ == 0;
  if (bVar9) {
    table_entry._8_8_ =
         ts_parser__get_cached_token
                   (_state,local_18,(ulong)last_external_token.ptr & 0xffffffff,
                    last_external_token_00,(TableEntry *)local_60);
  }
  if (table_entry._8_8_ == 0) {
    table_entry._8_8_ = ts_parser__lex(_state,position,local_18);
    ts_parser__set_cached_token
              (_state,(ulong)last_external_token.ptr & 0xffffffff,last_external_token_00,
               (Subtree)table_entry._8_8_);
    TVar5 = local_18;
    pTVar1 = _state->language;
    TVar4 = ts_subtree_symbol((Subtree)table_entry._8_8_);
    ts_language_table_entry(pTVar1,TVar5,TVar4,(TableEntry *)local_60);
  }
  do {
    action._4_4_ = 0xffffffff;
    for (action.params.field_0 =
              (anon_struct_4_3_2a6f56b2_for_anon_union_6_2_ecfd7102_for_params_0)0x0;
        (uint)action.params.field_0 < (uint)table_entry.actions._0_4_;
        action.params.field_0 = action.params.field_0 + 1) {
      _reduction_version =
           *(TSParseAction *)((long)local_60 + (ulong)(uint)action.params.field_0 * 8);
      switch((byte)next_state & 0xf) {
      case 0:
        if ((reduction_version._2_1_ >> 1 & 1) == 0) {
          if (((ulong)_reduction_version & 0x10000) == 0) {
            mutable_lookahead.data.parse_state = (TSSymbol)reduction_version;
            if (((_state->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
               (_state->dot_graph_file != (FILE *)0x0)) {
              snprintf((_state->lexer).debug_buffer,0x400,"shift state:%u",
                       (ulong)_reduction_version & 0xffff);
              ts_parser__log(_state);
            }
LAB_0012c84c:
            uVar6 = ts_subtree_child_count((Subtree)table_entry._8_8_);
            if (uVar6 != 0) {
              ts_parser__breakdown_lookahead
                        (_state,(Subtree *)&table_entry.action_count,local_18,&_state->reusable_node
                        );
              TVar5 = local_18;
              pTVar1 = _state->language;
              TVar4 = ts_subtree_symbol((Subtree)table_entry._8_8_);
              mutable_lookahead.data.parse_state = ts_language_next_state(pTVar1,TVar5,TVar4);
            }
            ts_parser__shift(_state,position,mutable_lookahead.data.parse_state,
                             (Subtree)table_entry._8_8_,(_Bool)(reduction_version._2_1_ & 1));
            if (bVar9) {
              return;
            }
            reusable_node_advance(&_state->reusable_node);
            return;
          }
          if (local_18 != 0) {
            mutable_lookahead.data.parse_state = local_18;
            if (((_state->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
               (_state->dot_graph_file != (FILE *)0x0)) {
              snprintf((_state->lexer).debug_buffer,0x400,"shift_extra");
              ts_parser__log(_state);
            }
            goto LAB_0012c84c;
          }
        }
        break;
      case 1:
        mutable_lookahead._5_1_ = 1 < (uint)table_entry.actions._0_4_;
        if (((_state->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (_state->dot_graph_file != (FILE *)0x0)) {
          pLVar2 = &_state->lexer;
          pcVar7 = ts_language_symbol_name(_state->language,(TSSymbol)reduction_version);
          snprintf(pLVar2->debug_buffer,0x400,"reduce sym:%s, child_count:%u",pcVar7,
                   (ulong)_reduction_version >> 0x20 & 0xff);
          ts_parser__log(_state);
        }
        mutable_lookahead._0_4_ =
             ts_parser__reduce(_state,position,(TSSymbol)reduction_version,(uint)bStack_84,
                               (int)reduction_version._2_2_,(ushort)is_fragile,
                               (_Bool)(mutable_lookahead._5_1_ & 1));
        if (mutable_lookahead._0_4_ != 0xffffffff) {
          action._4_4_ = mutable_lookahead._0_4_;
        }
        break;
      case 2:
        if (((_state->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (_state->dot_graph_file != (FILE *)0x0)) {
          snprintf((_state->lexer).debug_buffer,0x400,"accept");
          ts_parser__log(_state);
        }
        ts_parser__accept(_state,position,(Subtree)table_entry._8_8_);
        return;
      case 3:
        uVar6 = ts_subtree_child_count((Subtree)table_entry._8_8_);
        if (uVar6 != 0) {
          ts_parser__breakdown_lookahead
                    (_state,(Subtree *)&table_entry.action_count,0,&_state->reusable_node);
        }
        ts_parser__recover(_state,position,(Subtree)table_entry._8_8_);
        if (bVar9) {
          return;
        }
        reusable_node_advance(&_state->reusable_node);
        return;
      }
    }
    if (action._4_4_ == -1) {
      _Var3 = ts_subtree_is_keyword((Subtree)table_entry._8_8_);
      if (((_Var3) &&
          (TVar4 = ts_subtree_symbol((Subtree)table_entry._8_8_),
          TVar4 != _state->language->keyword_capture_token)) &&
         (ts_language_table_entry
                    (_state->language,local_18,_state->language->keyword_capture_token,
                     (TableEntry *)local_60),
         table_entry.actions._0_4_ !=
         (anon_struct_4_3_2a6f56b2_for_anon_union_6_2_ecfd7102_for_params_0)0x0)) {
        if (((_state->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (_state->dot_graph_file != (FILE *)0x0)) {
          pLVar2 = &_state->lexer;
          pTVar1 = _state->language;
          TVar4 = ts_subtree_symbol((Subtree)table_entry._8_8_);
          pcVar7 = ts_language_symbol_name(pTVar1,TVar4);
          pcVar8 = ts_language_symbol_name(_state->language,_state->language->keyword_capture_token)
          ;
          snprintf(pLVar2->debug_buffer,0x400,"switch from_keyword:%s, to_word_token:%s",pcVar7,
                   pcVar8);
          ts_parser__log(_state);
        }
        local_98 = ts_subtree_make_mut(&_state->tree_pool,(Subtree)table_entry._8_8_);
        ts_subtree_set_symbol(&local_98,_state->language->keyword_capture_token);
        table_entry._8_8_ = ts_subtree_from_mut(local_98);
      }
      else {
        if (local_18 == 0) {
          ts_parser__recover(_state,position,(Subtree)table_entry._8_8_);
          return;
        }
        _Var3 = ts_parser__breakdown_top_of_stack(_state,position);
        if (!_Var3) {
          if (((_state->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (_state->dot_graph_file != (FILE *)0x0)) {
            snprintf((_state->lexer).debug_buffer,0x400,"detect_error");
            ts_parser__log(_state);
          }
          uVar6 = position;
          self_00 = _state->stack;
          TVar4 = ts_subtree_leaf_symbol((Subtree)table_entry._8_8_);
          ts_stack_pause(self_00,uVar6,TVar4);
          ts_subtree_release(&_state->tree_pool,(Subtree)table_entry._8_8_);
          return;
        }
      }
    }
    else {
      ts_stack_renumber_version(_state->stack,action._4_4_,position);
      if (_state->dot_graph_file != (FILE *)0x0) {
        ts_stack_print_dot_graph(_state->stack,_state->language,_state->dot_graph_file);
        fputs("\n\n",(FILE *)_state->dot_graph_file);
      }
      TVar5 = ts_stack_state(_state->stack,position);
      pTVar1 = _state->language;
      local_18 = TVar5;
      TVar4 = ts_subtree_leaf_symbol((Subtree)table_entry._8_8_);
      ts_language_table_entry(pTVar1,TVar5,TVar4,(TableEntry *)local_60);
    }
  } while( true );
}

Assistant:

static void ts_parser__advance(TSParser *self, StackVersion version, bool allow_node_reuse) {
  TSStateId state = ts_stack_state(self->stack, version);
  uint32_t position = ts_stack_position(self->stack, version).bytes;
  Subtree last_external_token = ts_stack_last_external_token(self->stack, version);

  bool did_reuse = true;
  Subtree lookahead = NULL_SUBTREE;
  TableEntry table_entry = {.action_count = 0};

  // If possible, reuse a node from the previous syntax tree.
  if (allow_node_reuse) {
    lookahead = ts_parser__reuse_node(
      self, version, &state, position, last_external_token, &table_entry
    );
  }

  // Otherwise, try to reuse the token previously returned by the lexer.
  if (!lookahead.ptr) {
    did_reuse = false;
    lookahead = ts_parser__get_cached_token(
      self, state, position, last_external_token, &table_entry
    );
  }

  // Otherwise, re-run the lexer.
  if (!lookahead.ptr) {
    lookahead = ts_parser__lex(self, version, state);
    ts_parser__set_cached_token(self, position, last_external_token, lookahead);
    ts_language_table_entry(self->language, state, ts_subtree_symbol(lookahead), &table_entry);
  }

  for (;;) {
    StackVersion last_reduction_version = STACK_VERSION_NONE;

    for (uint32_t i = 0; i < table_entry.action_count; i++) {
      TSParseAction action = table_entry.actions[i];

      switch (action.type) {
        case TSParseActionTypeShift: {
          if (action.params.repetition) break;
          TSStateId next_state;
          if (action.params.extra) {

            // TODO: remove when TREE_SITTER_LANGUAGE_VERSION 9 is out.
            if (state == ERROR_STATE) continue;

            next_state = state;
            LOG("shift_extra");
          } else {
            next_state = action.params.state;
            LOG("shift state:%u", next_state);
          }

          if (ts_subtree_child_count(lookahead) > 0) {
            ts_parser__breakdown_lookahead(self, &lookahead, state, &self->reusable_node);
            next_state = ts_language_next_state(self->language, state, ts_subtree_symbol(lookahead));
          }

          ts_parser__shift(self, version, next_state, lookahead, action.params.extra);
          if (did_reuse) reusable_node_advance(&self->reusable_node);
          return;
        }

        case TSParseActionTypeReduce: {
          bool is_fragile = table_entry.action_count > 1;
          LOG("reduce sym:%s, child_count:%u", SYM_NAME(action.params.symbol), action.params.child_count);
          StackVersion reduction_version = ts_parser__reduce(
            self, version, action.params.symbol, action.params.child_count,
            action.params.dynamic_precedence, action.params.alias_sequence_id,
            is_fragile
          );
          if (reduction_version != STACK_VERSION_NONE) {
            last_reduction_version = reduction_version;
          }
          break;
        }

        case TSParseActionTypeAccept: {
          LOG("accept");
          ts_parser__accept(self, version, lookahead);
          return;
        }

        case TSParseActionTypeRecover: {
          if (ts_subtree_child_count(lookahead) > 0) {
            ts_parser__breakdown_lookahead(self, &lookahead, ERROR_STATE, &self->reusable_node);
          }

          ts_parser__recover(self, version, lookahead);
          if (did_reuse) reusable_node_advance(&self->reusable_node);
          return;
        }
      }
    }

    if (last_reduction_version != STACK_VERSION_NONE) {
      ts_stack_renumber_version(self->stack, last_reduction_version, version);
      LOG_STACK();
      state = ts_stack_state(self->stack, version);
      ts_language_table_entry(
        self->language,
        state,
        ts_subtree_leaf_symbol(lookahead),
        &table_entry
      );
      continue;
    }

    if (
      ts_subtree_is_keyword(lookahead) &&
      ts_subtree_symbol(lookahead) != self->language->keyword_capture_token
    ) {
      ts_language_table_entry(self->language, state, self->language->keyword_capture_token, &table_entry);
      if (table_entry.action_count > 0) {
        LOG(
          "switch from_keyword:%s, to_word_token:%s",
          TREE_NAME(lookahead),
          SYM_NAME(self->language->keyword_capture_token)
        );

        MutableSubtree mutable_lookahead = ts_subtree_make_mut(&self->tree_pool, lookahead);
        ts_subtree_set_symbol(&mutable_lookahead, self->language->keyword_capture_token);
        lookahead = ts_subtree_from_mut(mutable_lookahead);
        continue;
      }
    }

    if (state == ERROR_STATE) {
      ts_parser__recover(self, version, lookahead);
      return;
    }

    if (ts_parser__breakdown_top_of_stack(self, version)) {
      continue;
    }

    LOG("detect_error");
    ts_stack_pause(self->stack, version, ts_subtree_leaf_symbol(lookahead));
    ts_subtree_release(&self->tree_pool, lookahead);
    return;
  }
}